

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::CheckForStaleTipAndEvictPeers(PeerManagerImpl *this)

{
  long lVar1;
  CConnman *pCVar2;
  CChainParams *pCVar3;
  long lVar4;
  long lVar5;
  function<bool_(CNode_*)> func;
  function<bool_(CNode_*)> func_00;
  bool bVar6;
  int iVar7;
  time_point tVar8;
  pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *ppVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> youngest_peer;
  _Manager_type local_a8;
  _Invoker_type p_Stack_a0;
  int64_t oldest_block_announcement;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> next_youngest_peer;
  long local_50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock110;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock110.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock110.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock110.super_unique_lock);
  tVar8 = NodeClock::now();
  lVar5 = (long)tVar8.__d.__r / 1000000000;
  local_50 = lVar5;
  iVar7 = CConnman::GetExtraBlockRelayCount(this->m_connman);
  if (0 < iVar7) {
    youngest_peer.first = -1;
    youngest_peer.second.__r = 0;
    next_youngest_peer.first = -1;
    next_youngest_peer.second.__r = 0;
    pcStack_70 = std::
                 _Function_handler<void_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5524:31)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5524:31)>
               ::_M_manager;
    local_88._M_unused._M_object = &youngest_peer;
    local_88._8_8_ = &next_youngest_peer;
    CConnman::ForEachNode(this->m_connman,(NodeFn *)&local_88);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    ppVar9 = &youngest_peer;
    if (next_youngest_peer.second.__r < youngest_peer.second.__r) {
      ppVar9 = &next_youngest_peer;
    }
    local_88._8_8_ = &local_50;
    pcStack_70 = std::
                 _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5538:42)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5538:42)>
               ::_M_manager;
    func.super__Function_base._M_functor._8_8_ = youngest_peer.second.__r;
    func.super__Function_base._M_functor._M_unused._M_member_pointer = youngest_peer.first;
    func.super__Function_base._M_manager = local_a8;
    func._M_invoker = p_Stack_a0;
    local_88._M_unused._M_object = this;
    CConnman::ForNode(this->m_connman,ppVar9->first,func);
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
  }
  iVar7 = CConnman::GetExtraFullOutboundCount(this->m_connman);
  if (0 < iVar7) {
    next_youngest_peer.first = -1;
    oldest_block_announcement = 0x7fffffffffffffff;
    pCVar2 = this->m_connman;
    youngest_peer.first = 0;
    youngest_peer.second.__r = 0;
    youngest_peer.first = (long)operator_new(0x18);
    *(PeerManagerImpl **)youngest_peer.first = this;
    *(int64_t **)(youngest_peer.first + 8) = &oldest_block_announcement;
    *(pair<long,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> **)(youngest_peer.first + 0x10)
         = &next_youngest_peer;
    CConnman::ForEachNode(pCVar2,(NodeFn *)&youngest_peer);
    std::
    _Function_handler<void_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5571:31)>
    ::_M_manager((_Any_data *)&youngest_peer,(_Any_data *)&youngest_peer,__destroy_functor);
    lVar4 = next_youngest_peer.first;
    if (next_youngest_peer.first != -1) {
      pCVar2 = this->m_connman;
      youngest_peer.first = 0;
      youngest_peer.second.__r = 0;
      youngest_peer.first = (long)operator_new(0x18);
      *(PeerManagerImpl **)youngest_peer.first = this;
      *(long **)(youngest_peer.first + 8) = &local_50;
      *(int64_t **)(youngest_peer.first + 0x10) = &oldest_block_announcement;
      func_00.super__Function_base._M_functor._8_8_ = youngest_peer.second.__r;
      func_00.super__Function_base._M_functor._M_unused._M_object = (void *)youngest_peer.first;
      func_00.super__Function_base._M_manager =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5590:63)>
           ::_M_manager;
      func_00._M_invoker =
           std::
           _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5590:63)>
           ::_M_invoke;
      bVar6 = CConnman::ForNode(pCVar2,lVar4,func_00);
      std::
      _Function_handler<bool_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:5590:63)>
      ::_M_manager((_Any_data *)&youngest_peer,(_Any_data *)&youngest_peer,__destroy_functor);
      if (bVar6) {
        CConnman::SetTryNewOutboundPeer(this->m_connman,false);
      }
    }
  }
  if (lVar5 <= (this->m_stale_tip_check_time).__r) goto LAB_001c8f04;
  if ((((((this->m_chainman->m_blockman).m_importing._M_base._M_i & 1U) == 0) &&
       (((this->m_chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1U) != 0)) &&
      (((this->m_connman->fNetworkActive)._M_base._M_i & 1U) != 0)) &&
     (this->m_connman->m_use_addrman_outgoing == true)) {
    pCVar3 = this->m_chainparams;
    if ((this->m_last_tip_update)._M_i.__r == 0) {
      tVar8 = NodeClock::now();
      LOCK();
      (this->m_last_tip_update)._M_i.__r = (long)tVar8.__d.__r / 1000000000;
      UNLOCK();
    }
    lVar4 = (this->m_last_tip_update)._M_i.__r;
    tVar8 = NodeClock::now();
    if (((long)tVar8.__d.__r / 1000000000 + (pCVar3->consensus).nPowTargetSpacing * -3 <= lVar4) ||
       ((this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0))
    goto LAB_001c8ed5;
    local_88._M_unused._0_8_ = (undefined8)(lVar5 - (this->m_last_tip_update)._M_i.__r);
    logging_function._M_str = "CheckForStaleTipAndEvictPeers";
    logging_function._M_len = 0x1d;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x62;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x1602,ALL,Info,(ConstevalFormatString<1U>)0x7e80ed,
               (long *)local_88._M_pod_data);
    bVar6 = true;
LAB_001c8ee7:
    CConnman::SetTryNewOutboundPeer(this->m_connman,bVar6);
  }
  else {
LAB_001c8ed5:
    bVar6 = CConnman::GetTryNewOutboundPeer(this->m_connman);
    if (bVar6) {
      bVar6 = false;
      goto LAB_001c8ee7;
    }
  }
  (this->m_stale_tip_check_time).__r = lVar5 + 600;
LAB_001c8f04:
  if ((this->m_initial_sync_finished == false) && (bVar6 = CanDirectFetch(this), bVar6)) {
    CConnman::StartExtraBlockRelayPeers(this->m_connman);
    this->m_initial_sync_finished = true;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock110.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::CheckForStaleTipAndEvictPeers()
{
    LOCK(cs_main);

    auto now{GetTime<std::chrono::seconds>()};

    EvictExtraOutboundPeers(now);

    if (now > m_stale_tip_check_time) {
        // Check whether our tip is stale, and if so, allow using an extra
        // outbound peer
        if (!m_chainman.m_blockman.LoadingBlocks() && m_connman.GetNetworkActive() && m_connman.GetUseAddrmanOutgoing() && TipMayBeStale()) {
            LogPrintf("Potential stale tip detected, will try using extra outbound peer (last tip update: %d seconds ago)\n",
                      count_seconds(now - m_last_tip_update.load()));
            m_connman.SetTryNewOutboundPeer(true);
        } else if (m_connman.GetTryNewOutboundPeer()) {
            m_connman.SetTryNewOutboundPeer(false);
        }
        m_stale_tip_check_time = now + STALE_CHECK_INTERVAL;
    }

    if (!m_initial_sync_finished && CanDirectFetch()) {
        m_connman.StartExtraBlockRelayPeers();
        m_initial_sync_finished = true;
    }
}